

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_5::to_string_visitor::operator()(to_string_visitor *this,list_type *l)

{
  bool bVar1;
  bool bVar2;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *__variants;
  char *local_58;
  char *local_50;
  entry *item;
  const_iterator __end2;
  const_iterator __begin2;
  list_type *__range2;
  bool first;
  list_type *l_local;
  to_string_visitor *this_local;
  
  if ((this->single_line & 1U) == 0) {
    local_50 = "[\n";
  }
  else {
    local_50 = "[ ";
  }
  ::std::__cxx11::string::operator+=((string *)this->out,local_50);
  bVar1 = true;
  this->indent = this->indent + 1;
  __end2 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::begin(l);
  item = (entry *)::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::end(l);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                                *)&item);
    if (!bVar2) break;
    __variants = &__gnu_cxx::
                  __normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                  ::operator*(&__end2)->super_variant_type;
    if (!bVar1) {
      if ((this->single_line & 1U) == 0) {
        local_58 = ",\n";
      }
      else {
        local_58 = ", ";
      }
      ::std::__cxx11::string::operator+=((string *)this->out,local_58);
    }
    bVar1 = false;
    if ((this->single_line & 1U) == 0) {
      add_indent(this->out,this->indent);
    }
    ::std::
    visit<libtorrent::(anonymous_namespace)::to_string_visitor&,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
              (this,__variants);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
    ::operator++(&__end2);
  }
  ::std::__cxx11::string::operator+=((string *)this->out," ]");
  this->indent = this->indent + -1;
  return;
}

Assistant:

void operator()(entry::list_type const& l)
		{
			out += single_line ? "[ " : "[\n";
			bool first = true;
			++indent;
			for (auto const& item : l)
			{
				if (!first) out += single_line ? ", " : ",\n";
				first = false;
				if (!single_line) add_indent(out, indent);

				std::visit(*this, static_cast<entry::variant_type const&>(item));
			}
			out += " ]";
			--indent;
		}